

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<8,_16777232,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  byte bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  undefined1 auVar8 [16];
  Primitive *prim;
  bool bVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  uint uVar23;
  undefined1 auVar22 [64];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  ulong *local_1300;
  Ray *local_12f8;
  RayQueryContext *local_12f0;
  Primitive *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_1300 = local_11d8 + 1;
      aVar2 = (ray->dir).field_0;
      auVar19 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx((undefined1  [16])aVar2,auVar20);
      auVar25._8_4_ = 0x219392ef;
      auVar25._0_8_ = 0x219392ef219392ef;
      auVar25._12_4_ = 0x219392ef;
      auVar20 = vcmpps_avx(auVar20,auVar25,1);
      auVar20 = vblendvps_avx((undefined1  [16])aVar2,auVar25,auVar20);
      auVar25 = vrcpps_avx(auVar20);
      auVar26._8_4_ = 0x3f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._12_4_ = 0x3f800000;
      auVar20 = vfnmadd231ps_fma(auVar26,auVar25,auVar20);
      auVar8 = vfmadd132ps_fma(auVar20,auVar25,auVar25);
      fVar24 = auVar8._0_4_;
      local_1238._4_4_ = fVar24;
      local_1238._0_4_ = fVar24;
      local_1238._8_4_ = fVar24;
      local_1238._12_4_ = fVar24;
      local_1238._16_4_ = fVar24;
      local_1238._20_4_ = fVar24;
      local_1238._24_4_ = fVar24;
      local_1238._28_4_ = fVar24;
      auVar20 = vmovshdup_avx(auVar8);
      uVar21 = auVar20._0_8_;
      local_1258._8_8_ = uVar21;
      local_1258._0_8_ = uVar21;
      local_1258._16_8_ = uVar21;
      local_1258._24_8_ = uVar21;
      auVar26 = vshufpd_avx(auVar8,auVar8,1);
      auVar25 = vshufps_avx(auVar8,auVar8,0xaa);
      uVar21 = auVar25._0_8_;
      local_1278._8_8_ = uVar21;
      local_1278._0_8_ = uVar21;
      local_1278._16_8_ = uVar21;
      local_1278._24_8_ = uVar21;
      auVar27._0_4_ = fVar24 * (ray->org).field_0.m128[0];
      auVar27._4_4_ = auVar8._4_4_ * (ray->org).field_0.m128[1];
      auVar27._8_4_ = auVar8._8_4_ * (ray->org).field_0.m128[2];
      auVar27._12_4_ = auVar8._12_4_ * (ray->org).field_0.m128[3];
      auVar25 = vmovshdup_avx(auVar27);
      auVar8 = vshufps_avx(auVar27,auVar27,0xaa);
      uVar15 = (ulong)(fVar24 < 0.0) * 0x20;
      auVar29 = ZEXT3264(local_1278);
      uVar16 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x40;
      uVar14 = (ulong)(auVar26._0_4_ < 0.0) << 5 | 0x80;
      uVar11 = CONCAT44(auVar27._0_4_,auVar27._0_4_);
      local_1298._0_8_ = uVar11 ^ 0x8000000080000000;
      local_1298._8_4_ = -auVar27._0_4_;
      local_1298._12_4_ = -auVar27._0_4_;
      local_1298._16_4_ = -auVar27._0_4_;
      local_1298._20_4_ = -auVar27._0_4_;
      local_1298._24_4_ = -auVar27._0_4_;
      local_1298._28_4_ = -auVar27._0_4_;
      auVar30 = ZEXT3264(local_1298);
      uVar12 = auVar25._0_4_;
      uVar23 = auVar25._4_4_;
      local_12b8._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      local_12b8._8_4_ = uVar12 ^ 0x80000000;
      local_12b8._12_4_ = uVar23 ^ 0x80000000;
      local_12b8._16_4_ = uVar12 ^ 0x80000000;
      local_12b8._20_4_ = uVar23 ^ 0x80000000;
      local_12b8._24_4_ = uVar12 ^ 0x80000000;
      local_12b8._28_4_ = uVar23 ^ 0x80000000;
      auVar22 = ZEXT3264(local_1238);
      auVar31 = ZEXT3264(local_12b8);
      uVar12 = auVar8._0_4_;
      uVar23 = auVar8._4_4_;
      local_12d8._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
      local_12d8._8_4_ = uVar12 ^ 0x80000000;
      local_12d8._12_4_ = uVar23 ^ 0x80000000;
      local_12d8._16_4_ = uVar12 ^ 0x80000000;
      local_12d8._20_4_ = uVar23 ^ 0x80000000;
      local_12d8._24_4_ = uVar12 ^ 0x80000000;
      local_12d8._28_4_ = uVar23 ^ 0x80000000;
      auVar28 = ZEXT3264(local_1258);
      auVar32 = ZEXT3264(local_12d8);
      uVar18 = auVar19._0_4_;
      local_11f8._4_4_ = uVar18;
      local_11f8._0_4_ = uVar18;
      local_11f8._8_4_ = uVar18;
      local_11f8._12_4_ = uVar18;
      local_11f8._16_4_ = uVar18;
      local_11f8._20_4_ = uVar18;
      local_11f8._24_4_ = uVar18;
      local_11f8._28_4_ = uVar18;
      auVar33 = ZEXT3264(local_11f8);
      local_1218._4_4_ = fVar1;
      local_1218._0_4_ = fVar1;
      local_1218._8_4_ = fVar1;
      local_1218._12_4_ = fVar1;
      local_1218._16_4_ = fVar1;
      local_1218._20_4_ = fVar1;
      local_1218._24_4_ = fVar1;
      local_1218._28_4_ = fVar1;
      auVar34 = ZEXT3264(local_1218);
      local_12f8 = ray;
      local_12f0 = context;
LAB_01536a07:
      if (local_1300 != local_11d8) {
        uVar11 = local_1300[-1];
        local_1300 = local_1300 + -1;
LAB_01536a25:
        uVar18 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
        auVar17._4_4_ = uVar18;
        auVar17._0_4_ = uVar18;
        auVar17._8_4_ = uVar18;
        auVar17._12_4_ = uVar18;
        auVar17._16_4_ = uVar18;
        auVar17._20_4_ = uVar18;
        auVar17._24_4_ = uVar18;
        auVar17._28_4_ = uVar18;
        while ((uVar11 & 8) == 0) {
          uVar10 = uVar11 & 0xfffffffffffffff0;
          auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar15),auVar17,
                                    *(undefined1 (*) [32])(uVar10 + 0x40 + uVar15));
          auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar22._0_32_,auVar30._0_32_);
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar16),auVar17,
                                    *(undefined1 (*) [32])(uVar10 + 0x40 + uVar16));
          auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar28._0_32_,auVar31._0_32_);
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar20),ZEXT1632(auVar19));
          auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar14),auVar17,
                                    *(undefined1 (*) [32])(uVar10 + 0x40 + uVar14));
          auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar29._0_32_,auVar32._0_32_);
          auVar5 = vpmaxsd_avx2(ZEXT1632(auVar20),auVar33._0_32_);
          auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar15 ^ 0x20)),auVar17
                                    ,*(undefined1 (*) [32])(uVar10 + 0x40 + (uVar15 ^ 0x20)));
          auVar4 = vpmaxsd_avx2(auVar4,auVar5);
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar16 ^ 0x20)),auVar17
                                    ,*(undefined1 (*) [32])(uVar10 + 0x40 + (uVar16 ^ 0x20)));
          auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar22._0_32_,auVar30._0_32_);
          auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar28._0_32_,auVar31._0_32_);
          auVar5 = vpminsd_avx2(ZEXT1632(auVar20),ZEXT1632(auVar19));
          auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar14 ^ 0x20)),auVar17
                                    ,*(undefined1 (*) [32])(uVar10 + 0x40 + (uVar14 ^ 0x20)));
          auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar29._0_32_,auVar32._0_32_);
          auVar6 = vpminsd_avx2(ZEXT1632(auVar20),auVar34._0_32_);
          auVar5 = vpminsd_avx2(auVar5,auVar6);
          auVar4 = vcmpps_avx(auVar4,auVar5,2);
          auVar20 = auVar4._0_16_;
          if (((uint)uVar11 & 7) == 6) {
            auVar5 = vcmpps_avx(*(undefined1 (*) [32])(uVar10 + 0x1c0),auVar17,2);
            auVar6 = vcmpps_avx(auVar17,*(undefined1 (*) [32])(uVar10 + 0x1e0),1);
            auVar5 = vandps_avx(auVar5,auVar6);
            auVar4 = vandps_avx(auVar5,auVar4);
            auVar20 = auVar4._0_16_;
            auVar19 = auVar4._16_16_;
          }
          else {
            auVar19 = auVar4._16_16_;
          }
          auVar20 = vpackssdw_avx(auVar20,auVar19);
          auVar19 = vpsllw_avx(auVar20,0xf);
          auVar20 = vpacksswb_avx(auVar19,auVar19);
          bVar3 = SUB161(auVar20 >> 7,0) & 1 | (SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar20 >> 0x17,0) & 1) << 2 | (SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar20 >> 0x27,0) & 1) << 4 | (SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar20 >> 0x37,0) & 1) << 6 | SUB161(auVar20 >> 0x3f,0) << 7;
          if ((((((((auVar19 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar19 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar19 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar19 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar19 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar19 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar19 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar19[0xf]) goto LAB_01536a07;
          lVar7 = 0;
          for (uVar11 = (ulong)bVar3; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000)
          {
            lVar7 = lVar7 + 1;
          }
          uVar11 = *(ulong *)(uVar10 + lVar7 * 8);
          uVar12 = bVar3 - 1 & (uint)bVar3;
          uVar13 = (ulong)uVar12;
          if (uVar12 != 0) goto LAB_01536b62;
        }
        local_12e8 = (Primitive *)(uVar11 & 0xfffffffffffffff0);
        local_12e0 = (ulong)((uint)uVar11 & 0xf) - 7;
        while( true ) {
          local_12e0 = local_12e0 + -1;
          if (local_12e0 == 0) break;
          prim = local_12e8;
          local_12e8 = local_12e8 + 1;
          bVar9 = InstanceArrayIntersector1MB::occluded(&local_1301,ray,local_12f0,prim);
          auVar34 = ZEXT3264(local_1218);
          auVar33 = ZEXT3264(local_11f8);
          ray = local_12f8;
          if (bVar9) {
            local_12f8->tfar = -INFINITY;
            return;
          }
        }
        auVar22 = ZEXT3264(local_1238);
        auVar28 = ZEXT3264(local_1258);
        auVar29 = ZEXT3264(local_1278);
        auVar30 = ZEXT3264(local_1298);
        auVar31 = ZEXT3264(local_12b8);
        auVar32 = ZEXT3264(local_12d8);
        goto LAB_01536a07;
      }
    }
  }
  return;
LAB_01536b62:
  do {
    *local_1300 = uVar11;
    local_1300 = local_1300 + 1;
    lVar7 = 0;
    for (uVar11 = uVar13; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
      lVar7 = lVar7 + 1;
    }
    uVar13 = uVar13 - 1 & uVar13;
    uVar11 = *(ulong *)(uVar10 + lVar7 * 8);
  } while (uVar13 != 0);
  goto LAB_01536a25;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }